

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

bool __thiscall DFraggleThinker::wait_finished(DFraggleThinker *this,DRunningScript *script)

{
  int iVar1;
  DRunningScript *pDVar2;
  DSectorEffect *pDVar3;
  sector_t *psVar4;
  uint uVar5;
  DRunningScript *pDVar6;
  bool bVar7;
  FSectorTagIterator itr;
  FSectorTagIterator local_20;
  
  bVar7 = true;
  switch(script->wait_type) {
  case 1:
    iVar1 = script->wait_data;
    script->wait_data = iVar1 + -1;
    bVar7 = iVar1 < 2;
    break;
  case 2:
    local_20.searchtag = script->wait_data;
    if (local_20.searchtag == 0) {
      local_20.start = 0;
    }
    else {
      local_20.start = tagManager.TagHashFirst[(byte)local_20.searchtag];
    }
    uVar5 = FSectorTagIterator::Next(&local_20);
    bVar7 = true;
    if (-1 < (int)uVar5) {
      do {
        psVar4 = sectors;
        pDVar3 = sectors[uVar5].floordata.field_0.p;
        if (pDVar3 != (DSectorEffect *)0x0) {
          if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006b20a9;
          sectors[uVar5].floordata.field_0.p = (DSectorEffect *)0x0;
        }
        pDVar3 = psVar4[uVar5].ceilingdata.field_0.p;
        if (pDVar3 != (DSectorEffect *)0x0) {
          if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006b20a9;
          psVar4[uVar5].ceilingdata.field_0.p = (DSectorEffect *)0x0;
        }
        pDVar3 = psVar4[uVar5].lightingdata.field_0.p;
        if (pDVar3 != (DSectorEffect *)0x0) {
          if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006b20a9;
          psVar4[uVar5].lightingdata.field_0.p = (DSectorEffect *)0x0;
        }
        uVar5 = FSectorTagIterator::Next(&local_20);
      } while (-1 < (int)uVar5);
    }
    break;
  case 3:
    pDVar6 = (this->RunningScripts).field_0.p;
    if (pDVar6 == (DRunningScript *)0x0) {
LAB_006b2000:
      pDVar6 = (DRunningScript *)0x0;
    }
    else if (((pDVar6->super_DObject).ObjectFlags & 0x20) != 0) {
      (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
      goto LAB_006b2000;
    }
    do {
      pDVar2 = (pDVar6->next).field_0.p;
      if (pDVar2 == (DRunningScript *)0x0) {
        return true;
      }
      if (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0) {
        (pDVar6->next).field_0.p = (DRunningScript *)0x0;
        return true;
      }
      pDVar6 = pDVar2;
    } while ((pDVar2 == script) || (((pDVar2->script).field_0.p)->scriptnum != script->wait_data));
LAB_006b20a9:
    bVar7 = false;
    break;
  case 4:
    pDVar6 = (this->RunningScripts).field_0.p;
    if (pDVar6 == (DRunningScript *)0x0) {
LAB_006b2045:
      pDVar6 = (DRunningScript *)0x0;
    }
    else if (((pDVar6->super_DObject).ObjectFlags & 0x20) != 0) {
      (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
      goto LAB_006b2045;
    }
    do {
      pDVar2 = (pDVar6->next).field_0.p;
      if (pDVar2 == (DRunningScript *)0x0) goto LAB_006b20a9;
      if (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0) {
        (pDVar6->next).field_0.p = (DRunningScript *)0x0;
        goto LAB_006b20a9;
      }
      pDVar6 = pDVar2;
    } while ((pDVar2 == script) || (((pDVar2->script).field_0.p)->scriptnum != script->wait_data));
  }
  return bVar7;
}

Assistant:

bool DFraggleThinker::wait_finished(DRunningScript *script)
{
	switch(script->wait_type)
    {
    case wt_none: return true;        // uh? hehe
    case wt_scriptwait:               // waiting for script to finish
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current = current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return false;        // script still running
			}
			return true;        // can continue now
		}
		
    case wt_delay:                          // just count down
		{
			return --script->wait_data <= 0;
		}
		
    case wt_tagwait:
		{
			int secnum;
			FSectorTagIterator itr(script->wait_data);
			while ((secnum = itr.Next()) >= 0)
			{
				sector_t *sec = &sectors[secnum];
				if(sec->floordata || sec->ceilingdata || sec->lightingdata)
					return false;        // not finished
			}
			return true;
		}
		
    case wt_scriptwaitpre: // haleyjd - wait for script to start
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current=current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return true;        // script is now running
			}
			return false; // no running instances found
		}
		
    default: return true;
    }
	
	return false;
}